

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O0

void __thiscall
visitor_test_should_parse_utc_date_Test::TestBody(visitor_test_should_parse_utc_date_Test *this)

{
  bool bVar1;
  time_t *__timer;
  char *pcVar2;
  AssertHelper local_170;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_5;
  Message local_140;
  int local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_a0;
  Message local_98 [3];
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  tm tm;
  time_t local_28;
  time_t t;
  Date time;
  char *str;
  visitor_test_should_parse_utc_date_Test *this_local;
  
  time.m_time = (time_t)anon_var_dwarf_55997;
  __timer = (time_t *)strlen("20171105");
  t = (time_t)Fixpp::details::LexicalCast<Fixpp::Type::UTCDate>::cast("20171105",(size_t)__timer);
  local_28 = Fixpp::Type::UTCDate::Date::time((Date *)&t,__timer);
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_hour = 0;
  tm.tm_mday = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_gmtoff = 0;
  gmtime_r(&local_28,(tm *)&gtest_ar.message_);
  local_7c = 0x75;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_78,"tm.tm_year","117",&tm.tm_mday,&local_7c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x247,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(local_98);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_bc = 10;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_b8,"tm.tm_mon","10",&tm.tm_hour,&local_bc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x248,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_c8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_e4 = 5;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_e0,"tm.tm_mday","5",&tm.tm_min,&local_e4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
      if (!bVar1) {
        testing::Message::Message(&local_f0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                   ,0x249,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_f0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_10c = 0;
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_108,"tm.tm_hour","0",&tm.tm_sec,&local_10c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
        if (!bVar1) {
          testing::Message::Message(&local_118);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                     ,0x24a,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_118);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_118);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          local_134 = 0;
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_130,"tm.tm_min","0",
                     (int *)((long)&gtest_ar.message_.ptr_ + 4),&local_134);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
          if (!bVar1) {
            testing::Message::Message(&local_140);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                       ,0x24b,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_140);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_140);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            local_15c = 0;
            testing::internal::EqHelper<false>::Compare<int,int>
                      ((EqHelper<false> *)local_158,"tm.tm_sec","0",(int *)&gtest_ar.message_,
                       &local_15c);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
            if (!bVar1) {
              testing::Message::Message(&local_168);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
              testing::internal::AssertHelper::AssertHelper
                        (&local_170,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x24c,pcVar2);
              testing::internal::AssertHelper::operator=(&local_170,&local_168);
              testing::internal::AssertHelper::~AssertHelper(&local_170);
              testing::Message::~Message(&local_168);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(visitor_test, should_parse_utc_date)
{
    const char* str = "20171105";
    auto time = Fixpp::details::LexicalCast<Fixpp::Type::UTCDate>::cast(str, std::strlen(str));

    auto t = time.time();
    std::tm tm{};
    gmtime_r(&t, &tm);

    ASSERT_EQ(tm.tm_year, 117);
    ASSERT_EQ(tm.tm_mon, 10);
    ASSERT_EQ(tm.tm_mday, 5);
    ASSERT_EQ(tm.tm_hour, 0);
    ASSERT_EQ(tm.tm_min, 0);
    ASSERT_EQ(tm.tm_sec, 0);
}